

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapePiram>::ComputeVecandShape(TPZShapeData *data)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  long lVar4;
  long *plVar5;
  pair<int,_long> *ppVar6;
  ostream *poVar7;
  void *this;
  long in_RDI;
  int ivs;
  int maxd_1;
  int maxd;
  int d_1;
  int include_1;
  int shord [3];
  int maxorder [3];
  int sidedimension_1;
  int ish_1;
  int lastshape_1;
  int firstshape_1;
  MElementType tipo;
  int dir;
  int bil;
  int side_2;
  int ivec_1;
  int locvec_1;
  int d;
  int include;
  int sidedimension;
  int ish;
  int lastshape;
  int firstshape;
  int order;
  int connectindex;
  int face;
  int side_1;
  int ivec;
  int locvec;
  int firstface;
  int64_t nvec;
  TPZManVector<long,_27> FirstIndex;
  int scalarorder;
  TPZGenMatrix<int> shapeorders;
  int i;
  int counthold;
  TPZManVector<int,_27> permgather;
  int nlowdim;
  TPZStack<int,_10> smallsides;
  int side;
  int count;
  TPZManVector<int,_81> vecpermute;
  TPZManVector<int,_10> facevector;
  int nexternalvectors;
  int nshape;
  int pressureorder;
  TPZManVector<int,_57> normalsides;
  TPZManVector<int,_57> directions;
  TPZManVector<int,_57> bilinear;
  TPZManVector<int,_57> VectorSides;
  int64_t numvec;
  int *in_stack_fffffffffffff5c8;
  TPZManVector<int,_81> *in_stack_fffffffffffff5d0;
  TPZGenMatrix<int> *in_stack_fffffffffffff5d8;
  TPZStack<int,_10> *in_stack_fffffffffffff5e0;
  TPZVec<int> *in_stack_fffffffffffff5e8;
  TPZManVector<int,_81> *in_stack_fffffffffffff5f0;
  TPZVec<int> *in_stack_fffffffffffff5f8;
  TPZManVector<int,_10> *in_stack_fffffffffffff600;
  TPZGenMatrix<int> *in_stack_fffffffffffff640;
  undefined4 in_stack_fffffffffffff648;
  undefined4 in_stack_fffffffffffff64c;
  TPZVec<long> *in_stack_fffffffffffff650;
  TPZVec<int> *in_stack_fffffffffffff660;
  TPZShapeData *in_stack_fffffffffffff668;
  undefined8 in_stack_fffffffffffff670;
  pair<int,_int> local_8ac;
  int local_8a4;
  int local_8a0;
  int local_89c;
  int local_898;
  int local_894 [4];
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  MElementType local_86c;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  int local_858;
  pair<int,_int> local_854;
  int local_84c;
  int local_848;
  int local_844;
  int local_840;
  int local_83c;
  int local_838;
  int local_834;
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  int local_820;
  undefined4 local_81c;
  int64_t local_818;
  TPZVec<long> local_810 [7];
  int local_714;
  int local_6f8;
  int local_6f4;
  TPZVec<int> local_6f0 [4];
  int local_65c;
  TPZVec<int> local_658 [2];
  size_t in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  int iVar8;
  undefined4 in_stack_fffffffffffff9f4;
  int iVar9;
  TPZVec<int> local_608 [11];
  undefined4 local_49c;
  TPZVec<int> local_498 [2];
  int local_44c;
  int local_448;
  int local_444;
  TPZVec<int> local_338 [8];
  TPZVec<int> local_220 [8];
  TPZVec<int> local_118 [8];
  undefined8 local_10;
  long local_8;
  
  local_10 = 0x39;
  local_8 = in_RDI;
  TPZManVector<int,_57>::TPZManVector
            ((TPZManVector<int,_57> *)in_stack_fffffffffffff5f0,(int64_t)in_stack_fffffffffffff5e8);
  TPZManVector<int,_57>::TPZManVector
            ((TPZManVector<int,_57> *)in_stack_fffffffffffff5f0,(int64_t)in_stack_fffffffffffff5e8);
  TPZManVector<int,_57>::TPZManVector
            ((TPZManVector<int,_57> *)in_stack_fffffffffffff5f0,(int64_t)in_stack_fffffffffffff5e8);
  TPZManVector<int,_57>::TPZManVector
            ((TPZManVector<int,_57> *)in_stack_fffffffffffff5f0,(int64_t)in_stack_fffffffffffff5e8);
  pztopology::TPZPyramid::GetSideHDivDirections
            (&in_stack_fffffffffffff600->super_TPZVec<int>,in_stack_fffffffffffff5f8,
             &in_stack_fffffffffffff5f0->super_TPZVec<int>,in_stack_fffffffffffff5e8);
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar2 == 0) {
    pzinternal::DebugStopImpl
              ((char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               in_stack_fffffffffffff9e8);
  }
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),5);
  local_444 = *piVar3;
  local_448 = pzshape::TPZShapePiram::NShapeF(&in_stack_fffffffffffff5d0->super_TPZVec<int>);
  local_44c = 0;
  TPZVec<int>::size(local_118);
  local_49c = 0x12;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_fffffffffffff600,(int64_t)in_stack_fffffffffffff5f8,
             (int *)in_stack_fffffffffffff5f0);
  TPZManVector<int,_81>::TPZManVector(in_stack_fffffffffffff5f0,(int64_t)in_stack_fffffffffffff5e8);
  pzinternal::DebugStopImpl
            ((char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9e8);
  iVar9 = 0;
  for (iVar8 = 0; iVar1 = iVar9, iVar8 < 0x13; iVar8 = iVar8 + 1) {
    iVar1 = pztopology::TPZPyramid::SideDimension(0x18b2593);
    if (iVar1 == 2) {
      TPZStack<int,_10>::TPZStack(in_stack_fffffffffffff5e0);
      pztopology::TPZPyramid::LowerDimensionSides
                ((int)((ulong)in_stack_fffffffffffff5e0 >> 0x20),
                 (TPZStack<int,_10> *)in_stack_fffffffffffff5d8);
      iVar2 = TPZVec<int>::NElements(local_658);
      local_65c = (int)iVar2 + 1;
      TPZManVector<int,_27>::TPZManVector
                ((TPZManVector<int,_27> *)in_stack_fffffffffffff5f0,
                 (int64_t)in_stack_fffffffffffff5e8);
      HDivPermutation((int)((ulong)in_stack_fffffffffffff670 >> 0x20),in_stack_fffffffffffff668,
                      in_stack_fffffffffffff660);
      local_6f4 = iVar9;
      iVar9 = local_6f4;
      for (local_6f8 = 0; local_6f8 < local_65c; local_6f8 = local_6f8 + 1) {
        piVar3 = TPZVec<int>::operator[](local_6f0,(long)local_6f8);
        iVar1 = *piVar3 + local_6f4;
        piVar3 = TPZVec<int>::operator[](local_608,(long)(local_6f4 + local_6f8));
        *piVar3 = iVar1;
        iVar1 = iVar8;
        piVar3 = TPZVec<int>::operator[](local_498,(long)iVar9);
        *piVar3 = iVar8;
        iVar9 = iVar9 + 1;
        iVar8 = iVar1;
      }
      TPZManVector<int,_27>::~TPZManVector((TPZManVector<int,_27> *)in_stack_fffffffffffff5d0);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18b27b6);
    }
  }
  while (local_44c = iVar1, lVar4 = (long)iVar9, iVar2 = TPZVec<int>::size(local_608), lVar4 < iVar2
        ) {
    iVar1 = iVar9;
    piVar3 = TPZVec<int>::operator[](local_608,(long)iVar9);
    *piVar3 = iVar9;
    iVar9 = iVar1 + 1;
    iVar1 = local_44c;
  }
  TPZGenMatrix<int>::TPZGenMatrix
            ((TPZGenMatrix<int> *)in_stack_fffffffffffff5f0,(int64_t)in_stack_fffffffffffff5e8,
             (int64_t)in_stack_fffffffffffff5e0);
  pzshape::TPZShapePiram::ShapeOrder
            (in_stack_fffffffffffff650,
             (TPZVec<int> *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
             in_stack_fffffffffffff640);
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),5);
  local_714 = *piVar3 + 1;
  TPZManVector<long,_27>::TPZManVector
            ((TPZManVector<long,_27> *)in_stack_fffffffffffff5f0,(int64_t)in_stack_fffffffffffff5e8)
  ;
  FirstShapeIndex((TPZVec<long> *)in_stack_fffffffffffff5f0,(int *)in_stack_fffffffffffff5e8);
  local_818 = TPZVec<int>::NElements(local_118);
  iVar9 = 0;
  local_81c = 0xd;
  for (local_820 = 0; local_820 < local_44c; local_820 = local_820 + 1) {
    piVar3 = TPZVec<int>::operator[](local_608,(long)local_820);
    local_824 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_118,(long)local_824);
    local_828 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_498,(long)local_820);
    local_82c = *piVar3;
    local_830 = local_82c + -0xd;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),(long)local_830);
    local_834 = *piVar3;
    plVar5 = TPZVec<long>::operator[](local_810,(long)local_828);
    local_838 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_810,(long)(local_828 + 1));
    local_83c = (int)*plVar5;
    for (local_840 = local_838; local_840 < local_83c; local_840 = local_840 + 1) {
      local_844 = pztopology::TPZPyramid::SideDimension(0x18b2add);
      local_848 = 1;
      for (local_84c = 0; local_84c < local_844; local_84c = local_84c + 1) {
        piVar3 = TPZGenMatrix<int>::operator()
                           (in_stack_fffffffffffff5d8,(int64_t)in_stack_fffffffffffff5d0,
                            (int64_t)in_stack_fffffffffffff5c8);
        if (local_834 < *piVar3) {
          local_848 = 0;
        }
      }
      if (local_848 != 0) {
        local_854 = std::make_pair<int&,int&>(in_stack_fffffffffffff5c8,(int *)0x18b2bdb);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_854);
        iVar9 = iVar9 + 1;
      }
    }
  }
  for (local_858 = local_44c; local_858 < local_818; local_858 = local_858 + 1) {
    piVar3 = TPZVec<int>::operator[](local_608,(long)local_858);
    local_85c = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_118,(long)local_85c);
    local_860 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_220,(long)local_85c);
    local_864 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_338,(long)local_85c);
    local_868 = *piVar3;
    local_86c = pztopology::TPZPyramid::Type(local_860);
    plVar5 = TPZVec<long>::operator[](local_810,(long)local_860);
    local_870 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_810,(long)(local_860 + 1));
    local_874 = (int)*plVar5;
    for (local_878 = local_870; local_878 < local_874; local_878 = local_878 + 1) {
      local_87c = pztopology::TPZPyramid::SideDimension(0x18b2e01);
      local_894[3] = local_444;
      local_884 = local_444;
      local_880 = local_444;
      if (local_864 != 0) {
        local_894[(long)local_868 + 3] = local_894[(long)local_868 + 3] + 1;
      }
      memset(local_894,0,0xc);
      local_898 = 1;
      for (local_89c = 0; local_89c < local_87c; local_89c = local_89c + 1) {
        if ((local_86c == ETriangle) || (local_86c == ETetraedro)) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff5d8,(int64_t)in_stack_fffffffffffff5d0,
                              (int64_t)in_stack_fffffffffffff5c8);
          local_894[local_89c] = *piVar3;
          local_8a0 = local_894[(long)local_89c + 3] + 1;
          if (local_8a0 < local_894[local_89c]) {
            local_898 = 0;
          }
        }
        else if (local_86c == EQuadrilateral) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff5d8,(int64_t)in_stack_fffffffffffff5d0,
                              (int64_t)in_stack_fffffffffffff5c8);
          local_894[local_89c] = *piVar3;
          local_8a4 = local_894[(long)local_89c + 3];
          if (local_8a4 < local_894[local_89c]) {
            local_898 = 0;
          }
        }
        else if (local_86c == ECube) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff5d8,(int64_t)in_stack_fffffffffffff5d0,
                              (int64_t)in_stack_fffffffffffff5c8);
          local_894[local_89c] = *piVar3;
          if (local_894[(long)local_89c + 3] < local_894[local_89c]) {
            local_898 = 0;
          }
        }
        else if (local_86c == EPrisma) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff5d8,(int64_t)in_stack_fffffffffffff5d0,
                              (int64_t)in_stack_fffffffffffff5c8);
          if (local_894[(long)local_89c + 3] < *piVar3) {
            local_898 = 0;
          }
        }
        else if (local_86c == EOned) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff5d8,(int64_t)in_stack_fffffffffffff5d0,
                              (int64_t)in_stack_fffffffffffff5c8);
          local_894[0] = *piVar3;
          if (local_894[(long)local_89c + 3] < *piVar3) {
            local_898 = 0;
          }
        }
        else if (local_86c == EPiramide) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff5d8,(int64_t)in_stack_fffffffffffff5d0,
                              (int64_t)in_stack_fffffffffffff5c8);
          local_894[local_89c] = *piVar3;
          if (local_894[(long)local_89c + 3] < local_894[local_89c]) {
            local_898 = 0;
          }
        }
        else {
          pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffff9e8);
        }
      }
      if (local_898 != 0) {
        local_8ac = std::make_pair<int&,int&>(in_stack_fffffffffffff5c8,(int *)0x18b319f);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_8ac);
        iVar9 = iVar9 + 1;
      }
    }
  }
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar9 != (int)iVar2) {
    poVar7 = std::operator<<((ostream *)&std::cout,"count ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
    in_stack_fffffffffffff5d0 = (TPZManVector<int,_81> *)std::operator<<(poVar7,"\nivs ");
    this = (void *)std::ostream::operator<<(in_stack_fffffffffffff5d0,(int)iVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffff9e8);
  }
  TPZManVector<long,_27>::~TPZManVector((TPZManVector<long,_27> *)in_stack_fffffffffffff5d0);
  TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)in_stack_fffffffffffff5d0);
  TPZManVector<int,_81>::~TPZManVector(in_stack_fffffffffffff5d0);
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)in_stack_fffffffffffff5d0);
  TPZManVector<int,_57>::~TPZManVector((TPZManVector<int,_57> *)in_stack_fffffffffffff5d0);
  TPZManVector<int,_57>::~TPZManVector((TPZManVector<int,_57> *)in_stack_fffffffffffff5d0);
  TPZManVector<int,_57>::~TPZManVector((TPZManVector<int,_57> *)in_stack_fffffffffffff5d0);
  TPZManVector<int,_57>::~TPZManVector((TPZManVector<int,_57> *)in_stack_fffffffffffff5d0);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}